

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

void upb_Message_SetBaseField(upb_Message *msg,upb_MiniTableField *f,void *val)

{
  byte *pbVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t *puVar4;
  
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x13b,
                  "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                 );
  }
  if ((f->mode_dont_copy_me__upb_internal_use_only & 8) == 0) {
    if (f->presence < 1) {
      if (f->presence < 0) {
        puVar4 = _upb_Message_OneofCasePtr_dont_copy_me__upb_internal_use_only(msg,f);
        *puVar4 = f->number_dont_copy_me__upb_internal_use_only;
      }
    }
    else {
      uVar3 = _upb_MiniTableField_HasbitOffset_dont_copy_me__upb_internal_use_only(f);
      bVar2 = _upb_MiniTableField_HasbitMask_dont_copy_me__upb_internal_use_only(f);
      pbVar1 = (byte *)((long)&msg->field_0 + (ulong)uVar3);
      *pbVar1 = *pbVar1 | bVar2;
    }
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              (f,(void *)((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only
                         ),val);
    return;
  }
  __assert_fail("!upb_MiniTableField_IsExtension(f)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x13c,
                "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
               );
}

Assistant:

UPB_API_INLINE void upb_Message_SetBaseField(struct upb_Message* msg,
                                             const upb_MiniTableField* f,
                                             const void* val) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  UPB_ASSUME(!upb_MiniTableField_IsExtension(f));
  UPB_PRIVATE(_upb_Message_SetPresence)(msg, f);
  UPB_PRIVATE(_upb_MiniTableField_DataCopy)
  (f, UPB_PRIVATE(_upb_Message_MutableDataPtr)(msg, f), val);
}